

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.cpp
# Opt level: O0

String * asl::Url::params(String *__return_storage_ptr__,Dic<asl::String> *q)

{
  bool bVar1;
  EnumWrapper<const_asl::Dic<asl::String>_> *pEVar2;
  String *this;
  Dic<asl::String> *e;
  bool bVar3;
  String local_c0;
  String local_a8;
  String local_90;
  String local_78;
  String *local_60;
  String *k;
  String *v;
  EnumWrapper<asl::Dic<asl::String>_> local_40;
  EnumWrapper<asl::Dic<asl::String>_> *local_28;
  EnumWrapper_ *_b_;
  Dic<asl::String> d;
  Dic<asl::String> *q_local;
  
  d.super_Map<asl::String,_asl::String>.a._a =
       (Map<asl::String,_asl::String>)(Map<asl::String,_asl::String>)q;
  Dic<asl::String>::Dic((Dic<asl::String> *)&_b_);
  newEnumerator<asl::Dic<asl::String>>
            (&local_40,(asl *)d.super_Map<asl::String,_asl::String>.a._a,e);
  local_28 = &local_40;
  while( true ) {
    pEVar2 = enumData<asl::Dic<asl::String>const>
                       ((Dic<asl::String> *)0x0,&local_28->super_EnumWrapper_);
    bVar1 = EnumWrapper::operator_cast_to_bool((EnumWrapper *)pEVar2);
    bVar3 = false;
    if (bVar1) {
      bVar3 = (local_28->super_EnumWrapper_).more != 0;
    }
    if (!bVar3) break;
    pEVar2 = enumData<asl::Dic<asl::String>const>
                       ((Dic<asl::String> *)0x0,&local_28->super_EnumWrapper_);
    k = Map<asl::String,_asl::String>::Enumerator::operator*((Enumerator *)(pEVar2 + 8));
    while (0 < (local_28->super_EnumWrapper_).more) {
      pEVar2 = enumData<asl::Dic<asl::String>const>
                         ((Dic<asl::String> *)0x0,&local_28->super_EnumWrapper_);
      local_60 = Map<asl::String,_asl::String>::Enumerator::operator~((Enumerator *)(pEVar2 + 8));
      while ((local_28->super_EnumWrapper_).more != 0) {
        encode(&local_78,k,true);
        encode(&local_90,local_60,true);
        this = Map<asl::String,_asl::String>::operator[]
                         ((Map<asl::String,_asl::String> *)&_b_,&local_90);
        asl::String::operator=(this,&local_78);
        asl::String::~String(&local_90);
        asl::String::~String(&local_78);
        (local_28->super_EnumWrapper_).more = (local_28->super_EnumWrapper_).more + -1;
      }
      (local_28->super_EnumWrapper_).more = (local_28->super_EnumWrapper_).more + -2;
    }
    pEVar2 = enumData<asl::Dic<asl::String>const>
                       ((Dic<asl::String> *)0x0,&local_28->super_EnumWrapper_);
    Map<asl::String,_asl::String>::Enumerator::operator++((Enumerator *)(pEVar2 + 8));
    (local_28->super_EnumWrapper_).more = -1 - (local_28->super_EnumWrapper_).more;
  }
  asl::String::String(&local_a8,'&');
  asl::String::String(&local_c0,'=');
  Map<asl::String,_asl::String>::join
            (__return_storage_ptr__,(Map<asl::String,_asl::String> *)&_b_,&local_a8,&local_c0);
  asl::String::~String(&local_c0);
  asl::String::~String(&local_a8);
  Dic<asl::String>::~Dic((Dic<asl::String> *)&_b_);
  return __return_storage_ptr__;
}

Assistant:

String Url::params(const Dic<>& q)
{
	Dic<> d;
	foreach2(String& k, const String& v, q)
		d[Url::encode(k, true)] = Url::encode(v, true);
	return d.join('&', '=');
}